

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.c
# Opt level: O0

int BrotliTransformDictionaryWord
              (uint8_t *dst,uint8_t *word,int len,BrotliTransforms *transforms,int transfom_idx)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint local_68;
  int suffix_len;
  int step;
  uint8_t *uppercase;
  int skip;
  int i;
  int t;
  int prefix_len;
  uint8_t *suffix;
  byte *pbStack_38;
  uint8_t type;
  uint8_t *prefix;
  int idx;
  int transfom_idx_local;
  BrotliTransforms *transforms_local;
  uint8_t *puStack_18;
  int len_local;
  uint8_t *word_local;
  uint8_t *dst_local;
  
  prefix._0_4_ = 0;
  pbStack_38 = transforms->prefix_suffix +
               transforms->prefix_suffix_map[transforms->transforms[transfom_idx * 3]];
  bVar1 = transforms->transforms[transfom_idx * 3 + 1];
  _t = transforms->prefix_suffix +
       transforms->prefix_suffix_map[transforms->transforms[transfom_idx * 3 + 2]];
  i = (uint)*pbStack_38;
  while( true ) {
    pbStack_38 = pbStack_38 + 1;
    if (i == 0) break;
    dst[(int)prefix] = *pbStack_38;
    i = i + -1;
    prefix._0_4_ = (int)prefix + 1;
  }
  uVar2 = (uint)bVar1;
  uppercase._4_4_ = 0;
  puStack_18 = word;
  if (uVar2 < 10) {
    transforms_local._4_4_ = len - uVar2;
  }
  else {
    transforms_local._4_4_ = len;
    if ((0xb < uVar2) && (uVar2 < 0x15)) {
      puStack_18 = word + (int)(uVar2 - 0xb);
      transforms_local._4_4_ = len - (uVar2 - 0xb);
    }
  }
  while (uppercase._4_4_ < transforms_local._4_4_) {
    dst[(int)prefix] = puStack_18[uppercase._4_4_];
    uppercase._4_4_ = uppercase._4_4_ + 1;
    prefix._0_4_ = (int)prefix + 1;
  }
  if (uVar2 == 10) {
    ToUpperCase(dst + ((int)prefix - transforms_local._4_4_));
  }
  else if (uVar2 == 0xb) {
    _suffix_len = dst + ((int)prefix - transforms_local._4_4_);
    for (; 0 < transforms_local._4_4_; transforms_local._4_4_ = transforms_local._4_4_ - iVar3) {
      iVar3 = ToUpperCase(_suffix_len);
      _suffix_len = _suffix_len + iVar3;
    }
  }
  local_68 = (uint)*_t;
  while( true ) {
    _t = _t + 1;
    if (local_68 == 0) break;
    dst[(int)prefix] = *_t;
    local_68 = local_68 - 1;
    prefix._0_4_ = (int)prefix + 1;
  }
  return (int)prefix;
}

Assistant:

int BrotliTransformDictionaryWord(uint8_t* dst, const uint8_t* word, int len,
    const BrotliTransforms* BROTLI_RESTRICT transforms, int transfom_idx) {
  int idx = 0;
  const uint8_t* prefix = BROTLI_TRANSFORM_PREFIX(transforms, transfom_idx);
  uint8_t type = BROTLI_TRANSFORM_TYPE(transforms, transfom_idx);
  const uint8_t* suffix = BROTLI_TRANSFORM_SUFFIX(transforms, transfom_idx);
  {
    int prefix_len = *prefix++;
    while (prefix_len--) { dst[idx++] = *prefix++; }
  }
  {
    const int t = type;
    int i = 0;
    if (t <= BROTLI_TRANSFORM_OMIT_LAST_9) {
      len -= t;
    } else if (t >= BROTLI_TRANSFORM_OMIT_FIRST_1
        && t <= BROTLI_TRANSFORM_OMIT_FIRST_9) {
      int skip = t - (BROTLI_TRANSFORM_OMIT_FIRST_1 - 1);
      word += skip;
      len -= skip;
    }
    while (i < len) { dst[idx++] = word[i++]; }
    if (t == BROTLI_TRANSFORM_UPPERCASE_FIRST) {
      ToUpperCase(&dst[idx - len]);
    } else if (t == BROTLI_TRANSFORM_UPPERCASE_ALL) {
      uint8_t* uppercase = &dst[idx - len];
      while (len > 0) {
        int step = ToUpperCase(uppercase);
        uppercase += step;
        len -= step;
      }
    }
  }
  {
    int suffix_len = *suffix++;
    while (suffix_len--) { dst[idx++] = *suffix++; }
    return idx;
  }
}